

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

Curve * __thiscall ON_ShutLining::FindCurve(ON_ShutLining *this,ON_UUID *id)

{
  bool bVar1;
  ON_UUID OVar2;
  ON_UUID local_4c;
  ON_ShutLining *local_30;
  Curve *curve;
  CurveIterator it;
  ON_UUID *id_local;
  ON_ShutLining *this_local;
  
  it.m_impl = (CImpl *)id;
  GetCurveIterator((ON_ShutLining *)&curve);
  do {
    local_30 = (ON_ShutLining *)CurveIterator::Next((CurveIterator *)&curve);
    if (local_30 == (ON_ShutLining *)0x0) {
      this_local = (ON_ShutLining *)0x0;
      goto LAB_007495b5;
    }
    OVar2 = Curve::Id((Curve *)local_30);
    local_4c = OVar2;
    bVar1 = ::operator==(&local_4c,(ON_UUID_struct *)it.m_impl);
  } while (!bVar1);
  this_local = local_30;
LAB_007495b5:
  CurveIterator::~CurveIterator((CurveIterator *)&curve);
  return (Curve *)this_local;
}

Assistant:

ON_ShutLining::Curve* ON_ShutLining::FindCurve(const ON_UUID& id) const
{
  auto it = GetCurveIterator();
  while (Curve* curve = it.Next())
  {
    if (curve->Id() == id)
      return curve;
  }

  return nullptr;
}